

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_doubleFast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong *puVar5;
  BYTE *pBVar6;
  BYTE *pBVar7;
  undefined8 *puVar8;
  uint uVar9;
  BYTE *pBVar10;
  U32 *pUVar11;
  U32 *pUVar12;
  seqDef *psVar13;
  BYTE *pBVar14;
  bool bVar15;
  uint uVar16;
  undefined8 uVar17;
  uint uVar18;
  uint uVar19;
  BYTE *pStart;
  long lVar20;
  ulong *puVar21;
  byte bVar22;
  byte bVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  ulong *puVar27;
  ulong *puVar28;
  ulong uVar29;
  ulong *puVar30;
  long lVar31;
  ulong *puVar32;
  ulong uVar33;
  uint uVar34;
  U32 UVar35;
  ulong *puVar36;
  int *piVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  uint uVar41;
  ulong uVar42;
  int iVar43;
  ulong *puVar44;
  BYTE *litEnd;
  ulong *puVar45;
  int iVar46;
  ulong *puVar47;
  BYTE *litEnd_1;
  BYTE *pInLoopLimit;
  BYTE *litLimit_w_9;
  BYTE *litLimit_w;
  uint local_144;
  ulong *local_138;
  BYTE *local_130;
  ulong local_108;
  ulong *local_100;
  BYTE *local_e8;
  ulong local_e0;
  int local_c8;
  ulong local_a0;
  ulong local_90;
  ulong *local_78;
  ulong local_68;
  BYTE *local_60;
  
  pBVar10 = (ms->window).base;
  puVar5 = (ulong *)((long)src + srcSize);
  iVar46 = (int)pBVar10;
  iVar43 = (int)puVar5 - iVar46;
  uVar41 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar9 = (ms->window).dictLimit;
  uVar26 = iVar43 - uVar41;
  if (iVar43 - uVar9 <= uVar41) {
    uVar26 = uVar9;
  }
  if (ms->loadedDictEnd != 0) {
    uVar26 = uVar9;
  }
  puVar44 = (ulong *)(pBVar10 + uVar26);
  puVar45 = (ulong *)((long)src + (ulong)(puVar44 == (ulong *)src));
  iVar43 = (int)puVar45 - iVar46;
  uVar34 = iVar43 - uVar41;
  if (iVar43 - uVar9 <= uVar41) {
    uVar34 = uVar9;
  }
  if (ms->loadedDictEnd != 0) {
    uVar34 = uVar9;
  }
  uVar9 = rep[1];
  uVar34 = iVar43 - uVar34;
  uVar42 = (ulong)uVar34;
  uVar41 = 0;
  local_144 = uVar9;
  uVar18 = 0;
  if (uVar34 < uVar9) {
    local_144 = 0;
    uVar18 = uVar9;
  }
  puVar36 = (ulong *)((long)src + (srcSize - 8));
  uVar9 = *rep;
  uVar16 = uVar9;
  if (uVar9 <= uVar34) {
    uVar41 = uVar9;
    uVar16 = 0;
  }
  uVar33 = (ulong)uVar41;
  puVar21 = (ulong *)((long)src + (ulong)(puVar44 == (ulong *)src) + 1);
  uVar25 = (ms->cParams).minMatch;
  pUVar11 = ms->hashTable;
  pUVar12 = ms->chainTable;
  if (uVar25 == 5) {
    if (puVar21 <= puVar36) {
      uVar41 = (ms->cParams).hashLog;
      if ((uVar41 < 0x21) && (uVar25 = (ms->cParams).chainLog, uVar25 < 0x21)) {
        bVar22 = 0x40 - (char)uVar41;
        bVar23 = 0x40 - (char)uVar25;
        puVar1 = (ulong *)((long)puVar5 - 7);
        puVar2 = (ulong *)((long)puVar5 - 3);
        puVar3 = (ulong *)((long)puVar5 - 1);
        puVar4 = puVar5 + -4;
        uVar25 = 0xbb000000;
        local_100 = (ulong *)0xcf1bbcdcbb000000;
LAB_0014f89a:
        local_68 = *puVar45 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
        local_78 = puVar45 + 0x20;
        local_a0 = (ulong)pUVar11[local_68];
        puVar47 = (ulong *)(pBVar10 + local_a0);
        uVar41 = (uint)uVar33;
        lVar20 = -uVar33;
        puVar32 = (ulong *)((long)src + 0x10);
        local_e8 = (BYTE *)0x1;
        do {
          uVar38 = *puVar45;
          uVar29 = uVar38 * -0x30e4432345000000 >> (bVar23 & 0x3f);
          uVar19 = pUVar12[uVar29];
          UVar35 = (int)puVar45 - iVar46;
          piVar37 = (int *)(pBVar10 + uVar19);
          pUVar12[uVar29] = UVar35;
          pUVar11[local_68] = UVar35;
          puVar28 = puVar21;
          if ((uVar41 == 0) || (*(int *)((long)puVar45 + lVar20 + 1) != *(int *)((long)puVar45 + 1))
             ) {
            local_90 = *puVar21 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
            if ((uVar26 < (uint)local_a0) && (*puVar47 == uVar38)) {
              puVar30 = puVar45 + 1;
              puVar21 = puVar47 + 1;
              puVar27 = puVar30;
              if (puVar30 < puVar1) {
                uVar38 = *puVar30 ^ *puVar21;
                uVar42 = 0;
                if (uVar38 != 0) {
                  for (; (uVar38 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                  }
                }
                uVar42 = uVar42 >> 3 & 0x1fffffff;
                if (*puVar21 == *puVar30) {
                  puVar27 = puVar45 + 2;
                  puVar21 = puVar47 + 2;
                  do {
                    if (puVar1 <= puVar27) goto LAB_0014fd37;
                    uVar38 = *puVar21;
                    uVar29 = *puVar27;
                    uVar39 = uVar29 ^ uVar38;
                    uVar42 = 0;
                    if (uVar39 != 0) {
                      for (; (uVar39 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                      }
                    }
                    uVar42 = (long)puVar27 + ((uVar42 >> 3 & 0x1fffffff) - (long)puVar30);
                    puVar27 = puVar27 + 1;
                    puVar21 = puVar21 + 1;
                  } while (uVar38 == uVar29);
                }
              }
              else {
LAB_0014fd37:
                if ((puVar27 < puVar2) && ((int)*puVar21 == (int)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 4);
                  puVar21 = (ulong *)((long)puVar21 + 4);
                }
                if ((puVar27 < puVar3) && ((short)*puVar21 == (short)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 2);
                  puVar21 = (ulong *)((long)puVar21 + 2);
                }
                if (puVar27 < puVar5) {
                  puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar21 == (char)*puVar27));
                }
                uVar42 = (long)puVar27 - (long)puVar30;
              }
              uVar42 = uVar42 + 8;
              uVar25 = (int)puVar45 - (int)puVar47;
              iVar43 = 10;
              if ((puVar44 < puVar47) && (src < puVar45)) {
                while( true ) {
                  puVar30 = (ulong *)((long)puVar45 + -1);
                  puVar21 = (ulong *)((long)puVar47 + -1);
                  if (*(char *)puVar30 != *(char *)puVar21) break;
                  uVar42 = uVar42 + 1;
                  puVar45 = puVar30;
                  puVar47 = puVar21;
                  if ((puVar30 <= src) || (puVar21 <= puVar44)) break;
                }
              }
            }
            else {
              local_100 = (ulong *)(ulong)pUVar11[local_90];
              local_138 = (ulong *)(pBVar10 + (long)local_100);
              if ((uVar19 <= uVar26) || (iVar43 = 0xb, *piVar37 != (int)*puVar45)) {
                if (local_78 <= puVar21) {
                  local_e8 = (BYTE *)((long)local_e8 + 1);
                  local_78 = local_78 + 0x20;
                }
                iVar43 = 0;
                puVar28 = (ulong *)((long)puVar21 + (long)local_e8);
                puVar45 = puVar21;
                puVar47 = local_138;
                local_a0 = (ulong)local_100;
                local_68 = local_90;
              }
            }
          }
          else {
            puVar21 = (ulong *)((long)puVar45 + 5);
            puVar27 = (ulong *)((long)puVar45 + lVar20 + 5);
            puVar30 = puVar21;
            if (puVar21 < puVar1) {
              uVar38 = *puVar21 ^ *puVar27;
              uVar42 = 0;
              if (uVar38 != 0) {
                for (; (uVar38 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                }
              }
              uVar38 = uVar42 >> 3 & 0x1fffffff;
              if (*puVar27 == *puVar21) {
                puVar30 = (ulong *)((long)puVar45 + 0xd);
                puVar27 = (ulong *)((long)puVar45 + lVar20 + 0xd);
                do {
                  if (puVar1 <= puVar30) goto LAB_0014fb14;
                  uVar42 = *puVar27;
                  uVar29 = *puVar30;
                  uVar39 = uVar29 ^ uVar42;
                  uVar38 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                    }
                  }
                  uVar38 = (long)puVar30 + ((uVar38 >> 3 & 0x1fffffff) - (long)puVar21);
                  puVar30 = puVar30 + 1;
                  puVar27 = puVar27 + 1;
                } while (uVar42 == uVar29);
              }
            }
            else {
LAB_0014fb14:
              if ((puVar30 < puVar2) && ((int)*puVar27 == (int)*puVar30)) {
                puVar30 = (ulong *)((long)puVar30 + 4);
                puVar27 = (ulong *)((long)puVar27 + 4);
              }
              if ((puVar30 < puVar3) && ((short)*puVar27 == (short)*puVar30)) {
                puVar30 = (ulong *)((long)puVar30 + 2);
                puVar27 = (ulong *)((long)puVar27 + 2);
              }
              if (puVar30 < puVar5) {
                puVar30 = (ulong *)((long)puVar30 + (ulong)((char)*puVar27 == (char)*puVar30));
              }
              uVar38 = (long)puVar30 - (long)puVar21;
            }
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_001512e7;
            if (0x20000 < seqStore->maxNbLit) goto LAB_0015126b;
            puVar45 = (ulong *)((long)puVar45 + 1);
            uVar29 = (long)puVar45 - (long)src;
            puVar21 = (ulong *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar21 + uVar29))
            goto LAB_001512a9;
            if (puVar5 < puVar45) goto LAB_001512c8;
            if (puVar4 < puVar45) {
              ZSTD_safecopyLiterals((BYTE *)puVar21,(BYTE *)src,(BYTE *)puVar45,(BYTE *)puVar4);
            }
            else {
              uVar42 = *(ulong *)((long)src + 8);
              *puVar21 = *src;
              puVar21[1] = uVar42;
              if (0x10 < uVar29) {
                pBVar14 = seqStore->lit;
                if (0xffffffffffffffe0 < (ulong)((long)(pBVar14 + 0x10) + (-0x10 - (long)puVar32)))
                goto LAB_00151344;
                uVar42 = *(ulong *)((long)src + 0x18);
                *(ulong *)(pBVar14 + 0x10) = *puVar32;
                *(ulong *)(pBVar14 + 0x18) = uVar42;
                if (0x20 < (long)uVar29) {
                  lVar31 = 0;
                  do {
                    puVar8 = (undefined8 *)((long)src + lVar31 + 0x20);
                    uVar17 = puVar8[1];
                    pBVar6 = pBVar14 + lVar31 + 0x20;
                    *(undefined8 *)pBVar6 = *puVar8;
                    *(undefined8 *)(pBVar6 + 8) = uVar17;
                    puVar8 = (undefined8 *)((long)src + lVar31 + 0x30);
                    uVar17 = puVar8[1];
                    *(undefined8 *)(pBVar6 + 0x10) = *puVar8;
                    *(undefined8 *)(pBVar6 + 0x18) = uVar17;
                    lVar31 = lVar31 + 0x20;
                  } while (pBVar6 + 0x20 < pBVar14 + uVar29);
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar29;
            if (0xffff < uVar29) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00151325;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            uVar42 = uVar38 + 4;
            psVar13 = seqStore->sequences;
            psVar13->litLength = (U16)uVar29;
            psVar13->offBase = 1;
            if (uVar42 < 3) goto LAB_0015128a;
            if (0xffff < uVar38 + 1) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00151306;
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar13->mlBase = (U16)(uVar38 + 1);
            seqStore->sequences = psVar13 + 1;
            iVar43 = 7;
          }
          if (iVar43 != 0) goto LAB_0014fdf9;
          puVar21 = puVar28;
          if (puVar36 < puVar28) goto LAB_0014f7bb;
        } while( true );
      }
      goto LAB_00151363;
    }
  }
  else if (uVar25 == 6) {
    if (puVar21 <= puVar36) {
      uVar41 = (ms->cParams).hashLog;
      if ((uVar41 < 0x21) && (uVar25 = (ms->cParams).chainLog, uVar25 < 0x21)) {
        bVar22 = 0x40 - (char)uVar41;
        bVar23 = 0x40 - (char)uVar25;
        puVar1 = (ulong *)((long)puVar5 - 7);
        puVar2 = (ulong *)((long)puVar5 - 3);
        puVar3 = (ulong *)((long)puVar5 - 1);
        puVar4 = puVar5 + -4;
        uVar25 = 0xbf9b0000;
        local_100 = (ulong *)0xcf1bbcdcbf9b0000;
LAB_0014eb00:
        local_68 = *puVar45 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
        local_78 = puVar45 + 0x20;
        local_a0 = (ulong)pUVar11[local_68];
        puVar47 = (ulong *)(pBVar10 + local_a0);
        uVar41 = (uint)uVar33;
        lVar20 = -uVar33;
        puVar32 = (ulong *)((long)src + 0x10);
        local_e8 = (BYTE *)0x1;
        do {
          uVar38 = *puVar45;
          uVar29 = uVar38 * -0x30e4432340650000 >> (bVar23 & 0x3f);
          uVar19 = pUVar12[uVar29];
          UVar35 = (int)puVar45 - iVar46;
          piVar37 = (int *)(pBVar10 + uVar19);
          pUVar12[uVar29] = UVar35;
          pUVar11[local_68] = UVar35;
          puVar28 = puVar21;
          if ((uVar41 == 0) || (*(int *)((long)puVar45 + lVar20 + 1) != *(int *)((long)puVar45 + 1))
             ) {
            local_90 = *puVar21 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
            if ((uVar26 < (uint)local_a0) && (*puVar47 == uVar38)) {
              puVar30 = puVar45 + 1;
              puVar21 = puVar47 + 1;
              puVar27 = puVar30;
              if (puVar30 < puVar1) {
                uVar38 = *puVar30 ^ *puVar21;
                uVar42 = 0;
                if (uVar38 != 0) {
                  for (; (uVar38 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                  }
                }
                uVar42 = uVar42 >> 3 & 0x1fffffff;
                if (*puVar21 == *puVar30) {
                  puVar27 = puVar45 + 2;
                  puVar21 = puVar47 + 2;
                  do {
                    if (puVar1 <= puVar27) goto LAB_0014ef9d;
                    uVar38 = *puVar21;
                    uVar29 = *puVar27;
                    uVar39 = uVar29 ^ uVar38;
                    uVar42 = 0;
                    if (uVar39 != 0) {
                      for (; (uVar39 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                      }
                    }
                    uVar42 = (long)puVar27 + ((uVar42 >> 3 & 0x1fffffff) - (long)puVar30);
                    puVar27 = puVar27 + 1;
                    puVar21 = puVar21 + 1;
                  } while (uVar38 == uVar29);
                }
              }
              else {
LAB_0014ef9d:
                if ((puVar27 < puVar2) && ((int)*puVar21 == (int)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 4);
                  puVar21 = (ulong *)((long)puVar21 + 4);
                }
                if ((puVar27 < puVar3) && ((short)*puVar21 == (short)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 2);
                  puVar21 = (ulong *)((long)puVar21 + 2);
                }
                if (puVar27 < puVar5) {
                  puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar21 == (char)*puVar27));
                }
                uVar42 = (long)puVar27 - (long)puVar30;
              }
              uVar42 = uVar42 + 8;
              uVar25 = (int)puVar45 - (int)puVar47;
              iVar43 = 10;
              if ((puVar44 < puVar47) && (src < puVar45)) {
                while( true ) {
                  puVar30 = (ulong *)((long)puVar45 + -1);
                  puVar21 = (ulong *)((long)puVar47 + -1);
                  if (*(char *)puVar30 != *(char *)puVar21) break;
                  uVar42 = uVar42 + 1;
                  puVar45 = puVar30;
                  puVar47 = puVar21;
                  if ((puVar30 <= src) || (puVar21 <= puVar44)) break;
                }
              }
            }
            else {
              local_100 = (ulong *)(ulong)pUVar11[local_90];
              local_138 = (ulong *)(pBVar10 + (long)local_100);
              if ((uVar19 <= uVar26) || (iVar43 = 0xb, *piVar37 != (int)*puVar45)) {
                if (local_78 <= puVar21) {
                  local_e8 = (BYTE *)((long)local_e8 + 1);
                  local_78 = local_78 + 0x20;
                }
                iVar43 = 0;
                puVar28 = (ulong *)((long)puVar21 + (long)local_e8);
                puVar45 = puVar21;
                puVar47 = local_138;
                local_a0 = (ulong)local_100;
                local_68 = local_90;
              }
            }
          }
          else {
            puVar21 = (ulong *)((long)puVar45 + 5);
            puVar27 = (ulong *)((long)puVar45 + lVar20 + 5);
            puVar30 = puVar21;
            if (puVar21 < puVar1) {
              uVar38 = *puVar21 ^ *puVar27;
              uVar42 = 0;
              if (uVar38 != 0) {
                for (; (uVar38 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                }
              }
              uVar38 = uVar42 >> 3 & 0x1fffffff;
              if (*puVar27 == *puVar21) {
                puVar30 = (ulong *)((long)puVar45 + 0xd);
                puVar27 = (ulong *)((long)puVar45 + lVar20 + 0xd);
                do {
                  if (puVar1 <= puVar30) goto LAB_0014ed7a;
                  uVar42 = *puVar27;
                  uVar29 = *puVar30;
                  uVar39 = uVar29 ^ uVar42;
                  uVar38 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                    }
                  }
                  uVar38 = (long)puVar30 + ((uVar38 >> 3 & 0x1fffffff) - (long)puVar21);
                  puVar30 = puVar30 + 1;
                  puVar27 = puVar27 + 1;
                } while (uVar42 == uVar29);
              }
            }
            else {
LAB_0014ed7a:
              if ((puVar30 < puVar2) && ((int)*puVar27 == (int)*puVar30)) {
                puVar30 = (ulong *)((long)puVar30 + 4);
                puVar27 = (ulong *)((long)puVar27 + 4);
              }
              if ((puVar30 < puVar3) && ((short)*puVar27 == (short)*puVar30)) {
                puVar30 = (ulong *)((long)puVar30 + 2);
                puVar27 = (ulong *)((long)puVar27 + 2);
              }
              if (puVar30 < puVar5) {
                puVar30 = (ulong *)((long)puVar30 + (ulong)((char)*puVar27 == (char)*puVar30));
              }
              uVar38 = (long)puVar30 - (long)puVar21;
            }
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_001512e7;
            if (0x20000 < seqStore->maxNbLit) goto LAB_0015126b;
            puVar45 = (ulong *)((long)puVar45 + 1);
            uVar29 = (long)puVar45 - (long)src;
            puVar21 = (ulong *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar21 + uVar29))
            goto LAB_001512a9;
            if (puVar5 < puVar45) goto LAB_001512c8;
            if (puVar4 < puVar45) {
              ZSTD_safecopyLiterals((BYTE *)puVar21,(BYTE *)src,(BYTE *)puVar45,(BYTE *)puVar4);
            }
            else {
              uVar42 = *(ulong *)((long)src + 8);
              *puVar21 = *src;
              puVar21[1] = uVar42;
              if (0x10 < uVar29) {
                pBVar14 = seqStore->lit;
                if (0xffffffffffffffe0 < (ulong)((long)(pBVar14 + 0x10) + (-0x10 - (long)puVar32)))
                goto LAB_00151344;
                uVar42 = *(ulong *)((long)src + 0x18);
                *(ulong *)(pBVar14 + 0x10) = *puVar32;
                *(ulong *)(pBVar14 + 0x18) = uVar42;
                if (0x20 < (long)uVar29) {
                  lVar31 = 0;
                  do {
                    puVar8 = (undefined8 *)((long)src + lVar31 + 0x20);
                    uVar17 = puVar8[1];
                    pBVar6 = pBVar14 + lVar31 + 0x20;
                    *(undefined8 *)pBVar6 = *puVar8;
                    *(undefined8 *)(pBVar6 + 8) = uVar17;
                    puVar8 = (undefined8 *)((long)src + lVar31 + 0x30);
                    uVar17 = puVar8[1];
                    *(undefined8 *)(pBVar6 + 0x10) = *puVar8;
                    *(undefined8 *)(pBVar6 + 0x18) = uVar17;
                    lVar31 = lVar31 + 0x20;
                  } while (pBVar6 + 0x20 < pBVar14 + uVar29);
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar29;
            if (0xffff < uVar29) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00151325;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            uVar42 = uVar38 + 4;
            psVar13 = seqStore->sequences;
            psVar13->litLength = (U16)uVar29;
            psVar13->offBase = 1;
            if (uVar42 < 3) goto LAB_0015128a;
            if (0xffff < uVar38 + 1) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00151306;
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar13->mlBase = (U16)(uVar38 + 1);
            seqStore->sequences = psVar13 + 1;
            iVar43 = 7;
          }
          if (iVar43 != 0) goto LAB_0014f05f;
          puVar21 = puVar28;
          if (puVar36 < puVar28) goto LAB_0014f7bb;
        } while( true );
      }
      goto LAB_00151363;
    }
  }
  else if (uVar25 == 7) {
    if (puVar21 <= puVar36) {
      uVar41 = (ms->cParams).hashLog;
      if ((uVar41 < 0x21) && (uVar25 = (ms->cParams).chainLog, uVar25 < 0x21)) {
        bVar22 = 0x40 - (char)uVar41;
        bVar23 = 0x40 - (char)uVar25;
        puVar1 = (ulong *)((long)puVar5 - 7);
        puVar2 = (ulong *)((long)puVar5 - 3);
        puVar3 = (ulong *)((long)puVar5 - 1);
        puVar4 = puVar5 + -4;
        uVar25 = 0xbfa56300;
        local_100 = (ulong *)0xcf1bbcdcbfa56300;
LAB_0014ddc7:
        local_68 = *puVar45 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
        local_78 = puVar45 + 0x20;
        local_a0 = (ulong)pUVar11[local_68];
        puVar47 = (ulong *)(pBVar10 + local_a0);
        uVar41 = (uint)uVar33;
        lVar20 = -uVar33;
        puVar32 = (ulong *)((long)src + 0x10);
        local_e8 = (BYTE *)0x1;
        do {
          uVar38 = *puVar45;
          uVar29 = uVar38 * -0x30e44323405a9d00 >> (bVar23 & 0x3f);
          uVar19 = pUVar12[uVar29];
          UVar35 = (int)puVar45 - iVar46;
          piVar37 = (int *)(pBVar10 + uVar19);
          pUVar12[uVar29] = UVar35;
          pUVar11[local_68] = UVar35;
          puVar28 = puVar21;
          if ((uVar41 == 0) || (*(int *)((long)puVar45 + lVar20 + 1) != *(int *)((long)puVar45 + 1))
             ) {
            local_90 = *puVar21 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
            if ((uVar26 < (uint)local_a0) && (*puVar47 == uVar38)) {
              puVar30 = puVar45 + 1;
              puVar21 = puVar47 + 1;
              puVar27 = puVar30;
              if (puVar30 < puVar1) {
                uVar38 = *puVar30 ^ *puVar21;
                uVar42 = 0;
                if (uVar38 != 0) {
                  for (; (uVar38 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                  }
                }
                uVar42 = uVar42 >> 3 & 0x1fffffff;
                if (*puVar21 == *puVar30) {
                  puVar27 = puVar45 + 2;
                  puVar21 = puVar47 + 2;
                  do {
                    if (puVar1 <= puVar27) goto LAB_0014e264;
                    uVar38 = *puVar21;
                    uVar29 = *puVar27;
                    uVar39 = uVar29 ^ uVar38;
                    uVar42 = 0;
                    if (uVar39 != 0) {
                      for (; (uVar39 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                      }
                    }
                    uVar42 = (long)puVar27 + ((uVar42 >> 3 & 0x1fffffff) - (long)puVar30);
                    puVar27 = puVar27 + 1;
                    puVar21 = puVar21 + 1;
                  } while (uVar38 == uVar29);
                }
              }
              else {
LAB_0014e264:
                if ((puVar27 < puVar2) && ((int)*puVar21 == (int)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 4);
                  puVar21 = (ulong *)((long)puVar21 + 4);
                }
                if ((puVar27 < puVar3) && ((short)*puVar21 == (short)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 2);
                  puVar21 = (ulong *)((long)puVar21 + 2);
                }
                if (puVar27 < puVar5) {
                  puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar21 == (char)*puVar27));
                }
                uVar42 = (long)puVar27 - (long)puVar30;
              }
              uVar42 = uVar42 + 8;
              uVar25 = (int)puVar45 - (int)puVar47;
              iVar43 = 10;
              if ((puVar44 < puVar47) && (src < puVar45)) {
                while( true ) {
                  puVar30 = (ulong *)((long)puVar45 + -1);
                  puVar21 = (ulong *)((long)puVar47 + -1);
                  if (*(char *)puVar30 != *(char *)puVar21) break;
                  uVar42 = uVar42 + 1;
                  puVar45 = puVar30;
                  puVar47 = puVar21;
                  if ((puVar30 <= src) || (puVar21 <= puVar44)) break;
                }
              }
            }
            else {
              local_100 = (ulong *)(ulong)pUVar11[local_90];
              local_138 = (ulong *)(pBVar10 + (long)local_100);
              if ((uVar19 <= uVar26) || (iVar43 = 0xb, *piVar37 != (int)*puVar45)) {
                if (local_78 <= puVar21) {
                  local_e8 = (BYTE *)((long)local_e8 + 1);
                  local_78 = local_78 + 0x20;
                }
                iVar43 = 0;
                puVar28 = (ulong *)((long)puVar21 + (long)local_e8);
                puVar45 = puVar21;
                puVar47 = local_138;
                local_a0 = (ulong)local_100;
                local_68 = local_90;
              }
            }
          }
          else {
            puVar21 = (ulong *)((long)puVar45 + 5);
            puVar27 = (ulong *)((long)puVar45 + lVar20 + 5);
            puVar30 = puVar21;
            if (puVar21 < puVar1) {
              uVar38 = *puVar21 ^ *puVar27;
              uVar42 = 0;
              if (uVar38 != 0) {
                for (; (uVar38 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                }
              }
              uVar38 = uVar42 >> 3 & 0x1fffffff;
              if (*puVar27 == *puVar21) {
                puVar30 = (ulong *)((long)puVar45 + 0xd);
                puVar27 = (ulong *)((long)puVar45 + lVar20 + 0xd);
                do {
                  if (puVar1 <= puVar30) goto LAB_0014e041;
                  uVar42 = *puVar27;
                  uVar29 = *puVar30;
                  uVar39 = uVar29 ^ uVar42;
                  uVar38 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                    }
                  }
                  uVar38 = (long)puVar30 + ((uVar38 >> 3 & 0x1fffffff) - (long)puVar21);
                  puVar30 = puVar30 + 1;
                  puVar27 = puVar27 + 1;
                } while (uVar42 == uVar29);
              }
            }
            else {
LAB_0014e041:
              if ((puVar30 < puVar2) && ((int)*puVar27 == (int)*puVar30)) {
                puVar30 = (ulong *)((long)puVar30 + 4);
                puVar27 = (ulong *)((long)puVar27 + 4);
              }
              if ((puVar30 < puVar3) && ((short)*puVar27 == (short)*puVar30)) {
                puVar30 = (ulong *)((long)puVar30 + 2);
                puVar27 = (ulong *)((long)puVar27 + 2);
              }
              if (puVar30 < puVar5) {
                puVar30 = (ulong *)((long)puVar30 + (ulong)((char)*puVar27 == (char)*puVar30));
              }
              uVar38 = (long)puVar30 - (long)puVar21;
            }
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_001512e7;
            if (0x20000 < seqStore->maxNbLit) goto LAB_0015126b;
            puVar45 = (ulong *)((long)puVar45 + 1);
            uVar29 = (long)puVar45 - (long)src;
            puVar21 = (ulong *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar21 + uVar29))
            goto LAB_001512a9;
            if (puVar5 < puVar45) goto LAB_001512c8;
            if (puVar4 < puVar45) {
              ZSTD_safecopyLiterals((BYTE *)puVar21,(BYTE *)src,(BYTE *)puVar45,(BYTE *)puVar4);
            }
            else {
              uVar42 = *(ulong *)((long)src + 8);
              *puVar21 = *src;
              puVar21[1] = uVar42;
              if (0x10 < uVar29) {
                pBVar14 = seqStore->lit;
                if (0xffffffffffffffe0 < (ulong)((long)(pBVar14 + 0x10) + (-0x10 - (long)puVar32)))
                goto LAB_00151344;
                uVar42 = *(ulong *)((long)src + 0x18);
                *(ulong *)(pBVar14 + 0x10) = *puVar32;
                *(ulong *)(pBVar14 + 0x18) = uVar42;
                if (0x20 < (long)uVar29) {
                  lVar31 = 0;
                  do {
                    puVar8 = (undefined8 *)((long)src + lVar31 + 0x20);
                    uVar17 = puVar8[1];
                    pBVar6 = pBVar14 + lVar31 + 0x20;
                    *(undefined8 *)pBVar6 = *puVar8;
                    *(undefined8 *)(pBVar6 + 8) = uVar17;
                    puVar8 = (undefined8 *)((long)src + lVar31 + 0x30);
                    uVar17 = puVar8[1];
                    *(undefined8 *)(pBVar6 + 0x10) = *puVar8;
                    *(undefined8 *)(pBVar6 + 0x18) = uVar17;
                    lVar31 = lVar31 + 0x20;
                  } while (pBVar6 + 0x20 < pBVar14 + uVar29);
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar29;
            if (0xffff < uVar29) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00151325;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            uVar42 = uVar38 + 4;
            psVar13 = seqStore->sequences;
            psVar13->litLength = (U16)uVar29;
            psVar13->offBase = 1;
            if (uVar42 < 3) goto LAB_0015128a;
            if (0xffff < uVar38 + 1) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00151306;
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar13->mlBase = (U16)(uVar38 + 1);
            seqStore->sequences = psVar13 + 1;
            iVar43 = 7;
          }
          if (iVar43 != 0) goto LAB_0014e326;
          puVar21 = puVar28;
          if (puVar36 < puVar28) goto LAB_0014f7bb;
        } while( true );
      }
LAB_00151363:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
  }
  else if (puVar21 <= puVar36) {
    uVar41 = (ms->cParams).hashLog;
    if ((uVar41 < 0x21) && (uVar25 = (ms->cParams).chainLog, uVar25 < 0x21)) {
      bVar22 = 0x40 - (char)uVar41;
      bVar23 = 0x20 - (char)uVar25;
      puVar1 = (ulong *)((long)puVar5 - 7);
      puVar2 = (ulong *)((long)puVar5 - 3);
      puVar3 = (ulong *)((long)puVar5 - 1);
      puVar4 = puVar5 + -4;
      pBVar14 = pBVar10 + -1;
      local_130 = pBVar14;
      local_e8 = pBVar14;
LAB_001505b2:
      local_68 = *puVar45 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
      local_138 = puVar45 + 0x20;
      local_60 = (BYTE *)(ulong)pUVar11[local_68];
      puVar47 = (ulong *)(local_60 + (long)pBVar10);
      uVar41 = (uint)uVar33;
      lVar20 = -uVar33;
      puVar32 = (ulong *)((long)src + 0x10);
      local_108 = 1;
      do {
        uVar19 = (uint)((int)*puVar45 * -0x61c8864f) >> (bVar23 & 0x1f);
        uVar25 = pUVar12[uVar19];
        UVar35 = (int)puVar45 - iVar46;
        piVar37 = (int *)(pBVar10 + uVar25);
        pUVar12[uVar19] = UVar35;
        pUVar11[local_68] = UVar35;
        puVar28 = puVar21;
        if ((uVar41 == 0) || (*(int *)((long)puVar45 + lVar20 + 1) != *(int *)((long)puVar45 + 1)))
        {
          local_e0 = *puVar21 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
          if ((uVar26 < (uint)local_60) && (*puVar47 == *puVar45)) {
            puVar30 = puVar45 + 1;
            puVar21 = puVar47 + 1;
            puVar27 = puVar30;
            if (puVar30 < puVar1) {
              uVar38 = *puVar30 ^ *puVar21;
              uVar42 = 0;
              if (uVar38 != 0) {
                for (; (uVar38 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                }
              }
              uVar42 = uVar42 >> 3 & 0x1fffffff;
              if (*puVar21 == *puVar30) {
                puVar27 = puVar45 + 2;
                puVar21 = puVar47 + 2;
                do {
                  if (puVar1 <= puVar27) goto LAB_00150a40;
                  uVar38 = *puVar21;
                  uVar29 = *puVar27;
                  uVar39 = uVar29 ^ uVar38;
                  uVar42 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                    }
                  }
                  uVar42 = (long)puVar27 + ((uVar42 >> 3 & 0x1fffffff) - (long)puVar30);
                  puVar27 = puVar27 + 1;
                  puVar21 = puVar21 + 1;
                } while (uVar38 == uVar29);
              }
            }
            else {
LAB_00150a40:
              if ((puVar27 < puVar2) && ((int)*puVar21 == (int)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 4);
                puVar21 = (ulong *)((long)puVar21 + 4);
              }
              if ((puVar27 < puVar3) && ((short)*puVar21 == (short)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 2);
                puVar21 = (ulong *)((long)puVar21 + 2);
              }
              if (puVar27 < puVar5) {
                puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar21 == (char)*puVar27));
              }
              uVar42 = (long)puVar27 - (long)puVar30;
            }
            uVar42 = uVar42 + 8;
            local_130 = (BYTE *)(ulong)(uint)((int)puVar45 - (int)puVar47);
            iVar43 = 10;
            if ((puVar44 < puVar47) && (src < puVar45)) {
              while( true ) {
                puVar30 = (ulong *)((long)puVar45 + -1);
                puVar21 = (ulong *)((long)puVar47 + -1);
                if (*(char *)puVar30 != *(char *)puVar21) break;
                uVar42 = uVar42 + 1;
                puVar45 = puVar30;
                puVar47 = puVar21;
                if ((puVar30 <= src) || (puVar21 <= puVar44)) break;
              }
            }
          }
          else {
            local_e8 = (BYTE *)(ulong)pUVar11[local_e0];
            local_100 = (ulong *)(local_e8 + (long)pBVar10);
            if ((uVar25 <= uVar26) || (iVar43 = 0xb, *piVar37 != (int)*puVar45)) {
              if (local_138 <= puVar21) {
                local_108 = local_108 + 1;
                local_138 = local_138 + 0x20;
              }
              iVar43 = 0;
              puVar28 = (ulong *)((long)puVar21 + local_108);
              puVar45 = puVar21;
              puVar47 = local_100;
              local_68 = local_e0;
              local_60 = local_e8;
            }
          }
        }
        else {
          puVar21 = (ulong *)((long)puVar45 + 5);
          puVar27 = (ulong *)((long)puVar45 + lVar20 + 5);
          puVar30 = puVar21;
          if (puVar21 < puVar1) {
            uVar38 = *puVar21 ^ *puVar27;
            uVar42 = 0;
            if (uVar38 != 0) {
              for (; (uVar38 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
              }
            }
            uVar38 = uVar42 >> 3 & 0x1fffffff;
            if (*puVar27 == *puVar21) {
              puVar30 = (ulong *)((long)puVar45 + 0xd);
              puVar27 = (ulong *)((long)puVar45 + lVar20 + 0xd);
              do {
                if (puVar1 <= puVar30) goto LAB_00150825;
                uVar42 = *puVar27;
                uVar29 = *puVar30;
                uVar39 = uVar29 ^ uVar42;
                uVar38 = 0;
                if (uVar39 != 0) {
                  for (; (uVar39 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                  }
                }
                uVar38 = (long)puVar30 + ((uVar38 >> 3 & 0x1fffffff) - (long)puVar21);
                puVar30 = puVar30 + 1;
                puVar27 = puVar27 + 1;
              } while (uVar42 == uVar29);
            }
          }
          else {
LAB_00150825:
            if ((puVar30 < puVar2) && ((int)*puVar27 == (int)*puVar30)) {
              puVar30 = (ulong *)((long)puVar30 + 4);
              puVar27 = (ulong *)((long)puVar27 + 4);
            }
            if ((puVar30 < puVar3) && ((short)*puVar27 == (short)*puVar30)) {
              puVar30 = (ulong *)((long)puVar30 + 2);
              puVar27 = (ulong *)((long)puVar27 + 2);
            }
            if (puVar30 < puVar5) {
              puVar30 = (ulong *)((long)puVar30 + (ulong)((char)*puVar27 == (char)*puVar30));
            }
            uVar38 = (long)puVar30 - (long)puVar21;
          }
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_001512e7;
          if (0x20000 < seqStore->maxNbLit) goto LAB_0015126b;
          puVar45 = (ulong *)((long)puVar45 + 1);
          uVar29 = (long)puVar45 - (long)src;
          puVar21 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar21 + uVar29))
          goto LAB_001512a9;
          if (puVar5 < puVar45) goto LAB_001512c8;
          if (puVar4 < puVar45) {
            ZSTD_safecopyLiterals((BYTE *)puVar21,(BYTE *)src,(BYTE *)puVar45,(BYTE *)puVar4);
          }
          else {
            uVar42 = *(ulong *)((long)src + 8);
            *puVar21 = *src;
            puVar21[1] = uVar42;
            if (0x10 < uVar29) {
              pBVar6 = seqStore->lit;
              if (0xffffffffffffffe0 < (ulong)((long)(pBVar6 + 0x10) + (-0x10 - (long)puVar32)))
              goto LAB_00151344;
              uVar42 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar6 + 0x10) = *puVar32;
              *(ulong *)(pBVar6 + 0x18) = uVar42;
              if (0x20 < (long)uVar29) {
                lVar31 = 0;
                do {
                  puVar8 = (undefined8 *)((long)src + lVar31 + 0x20);
                  uVar17 = puVar8[1];
                  pBVar7 = pBVar6 + lVar31 + 0x20;
                  *(undefined8 *)pBVar7 = *puVar8;
                  *(undefined8 *)(pBVar7 + 8) = uVar17;
                  puVar8 = (undefined8 *)((long)src + lVar31 + 0x30);
                  uVar17 = puVar8[1];
                  *(undefined8 *)(pBVar7 + 0x10) = *puVar8;
                  *(undefined8 *)(pBVar7 + 0x18) = uVar17;
                  lVar31 = lVar31 + 0x20;
                } while (pBVar7 + 0x20 < pBVar6 + uVar29);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar29;
          if (0xffff < uVar29) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00151325;
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          uVar42 = uVar38 + 4;
          psVar13 = seqStore->sequences;
          psVar13->litLength = (U16)uVar29;
          psVar13->offBase = 1;
          if (uVar42 < 3) goto LAB_0015128a;
          if (0xffff < uVar38 + 1) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00151306;
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar13->mlBase = (U16)(uVar38 + 1);
          seqStore->sequences = psVar13 + 1;
          iVar43 = 7;
        }
        if (iVar43 != 0) goto LAB_00150b05;
        puVar21 = puVar28;
        if (puVar36 < puVar28) goto LAB_0014f7bb;
      } while( true );
    }
    goto LAB_00151363;
  }
LAB_0014f7bb:
  uVar26 = uVar18;
  if (uVar41 != 0) {
    uVar16 = uVar41;
    uVar26 = uVar9;
  }
  if (uVar9 <= uVar34) {
    uVar26 = uVar18;
  }
  *rep = uVar16;
  if (local_144 != 0) {
    uVar26 = local_144;
  }
  rep[1] = uVar26;
  return (long)puVar5 - (long)src;
LAB_0014fdf9:
  if (iVar43 != 7) {
    iVar24 = (int)puVar28;
    if (iVar43 != 10) {
      if (iVar43 != 0xb) {
        return (size_t)puVar5;
      }
      if ((uVar26 < (uint)local_100) && (*local_138 == *puVar28)) {
        puVar45 = puVar28 + 1;
        puVar21 = local_138 + 1;
        puVar47 = puVar45;
        if (puVar45 < puVar1) {
          uVar33 = *puVar45 ^ *puVar21;
          uVar42 = 0;
          if (uVar33 != 0) {
            for (; (uVar33 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
            }
          }
          uVar42 = uVar42 >> 3 & 0x1fffffff;
          if (*puVar21 == *puVar45) {
            puVar47 = puVar28 + 2;
            puVar21 = local_138 + 2;
            do {
              if (puVar1 <= puVar47) goto LAB_00150016;
              uVar33 = *puVar21;
              uVar38 = *puVar47;
              uVar29 = uVar38 ^ uVar33;
              uVar42 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                }
              }
              uVar42 = (long)puVar47 + ((uVar42 >> 3 & 0x1fffffff) - (long)puVar45);
              puVar47 = puVar47 + 1;
              puVar21 = puVar21 + 1;
            } while (uVar33 == uVar38);
          }
        }
        else {
LAB_00150016:
          if ((puVar47 < puVar2) && ((int)*puVar21 == (int)*puVar47)) {
            puVar47 = (ulong *)((long)puVar47 + 4);
            puVar21 = (ulong *)((long)puVar21 + 4);
          }
          if ((puVar47 < puVar3) && ((short)*puVar21 == (short)*puVar47)) {
            puVar47 = (ulong *)((long)puVar47 + 2);
            puVar21 = (ulong *)((long)puVar21 + 2);
          }
          if (puVar47 < puVar5) {
            puVar47 = (ulong *)((long)puVar47 + (ulong)((char)*puVar21 == (char)*puVar47));
          }
          uVar42 = (long)puVar47 - (long)puVar45;
        }
        uVar42 = uVar42 + 8;
        uVar25 = iVar24 - (int)local_138;
        puVar45 = puVar28;
        if ((puVar44 < local_138) && (src < puVar28)) {
          while( true ) {
            puVar47 = (ulong *)((long)puVar28 + -1);
            puVar21 = (ulong *)((long)local_138 + -1);
            puVar45 = puVar28;
            if (*(char *)puVar47 != *(char *)puVar21) break;
            uVar42 = uVar42 + 1;
            puVar45 = puVar47;
            local_138 = puVar21;
            if ((puVar47 <= src) || (puVar28 = puVar47, puVar21 <= puVar44)) break;
          }
        }
      }
      else {
        puVar47 = (ulong *)((long)puVar45 + 4);
        puVar21 = (ulong *)(piVar37 + 1);
        puVar28 = puVar47;
        if (puVar47 < puVar1) {
          uVar33 = *puVar47 ^ *puVar21;
          uVar42 = 0;
          if (uVar33 != 0) {
            for (; (uVar33 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
            }
          }
          uVar42 = uVar42 >> 3 & 0x1fffffff;
          if (*puVar21 == *puVar47) {
            puVar28 = (ulong *)((long)puVar45 + 0xc);
            puVar21 = (ulong *)(piVar37 + 3);
            do {
              if (puVar1 <= puVar28) goto LAB_0014ff52;
              uVar33 = *puVar21;
              uVar38 = *puVar28;
              uVar29 = uVar38 ^ uVar33;
              uVar42 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                }
              }
              uVar42 = (long)puVar28 + ((uVar42 >> 3 & 0x1fffffff) - (long)puVar47);
              puVar28 = puVar28 + 1;
              puVar21 = puVar21 + 1;
            } while (uVar33 == uVar38);
          }
        }
        else {
LAB_0014ff52:
          if ((puVar28 < puVar2) && ((int)*puVar21 == (int)*puVar28)) {
            puVar28 = (ulong *)((long)puVar28 + 4);
            puVar21 = (ulong *)((long)puVar21 + 4);
          }
          if ((puVar28 < puVar3) && ((short)*puVar21 == (short)*puVar28)) {
            puVar28 = (ulong *)((long)puVar28 + 2);
            puVar21 = (ulong *)((long)puVar21 + 2);
          }
          if (puVar28 < puVar5) {
            puVar28 = (ulong *)((long)puVar28 + (ulong)((char)*puVar21 == (char)*puVar28));
          }
          uVar42 = (long)puVar28 - (long)puVar47;
        }
        uVar42 = uVar42 + 4;
        local_e0._0_4_ = (int)piVar37;
        uVar25 = (int)puVar45 - (int)local_e0;
        if ((uVar26 < uVar19) && (src < puVar45)) {
          puVar21 = (ulong *)(pBVar10 + ((ulong)uVar19 - 1));
          do {
            puVar47 = (ulong *)((long)puVar45 + -1);
            if ((*(char *)puVar47 != (char)*puVar21) ||
               (uVar42 = uVar42 + 1, puVar45 = puVar47, puVar47 <= src)) break;
            bVar15 = puVar44 < puVar21;
            puVar21 = (ulong *)((long)puVar21 + -1);
          } while (bVar15);
        }
      }
    }
    if (local_e8 < 4) {
      pUVar11[local_90] = iVar24 - iVar46;
    }
    if (uVar25 == 0) goto LAB_00151382;
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) goto LAB_001512e7;
    if (0x20000 < seqStore->maxNbLit) goto LAB_0015126b;
    uVar33 = (long)puVar45 - (long)src;
    puVar21 = (ulong *)seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar21 + uVar33))
    goto LAB_001512a9;
    if (puVar5 < puVar45) goto LAB_001512c8;
    if (puVar4 < puVar45) {
      ZSTD_safecopyLiterals((BYTE *)puVar21,(BYTE *)src,(BYTE *)puVar45,(BYTE *)puVar4);
    }
    else {
      uVar38 = *(ulong *)((long)src + 8);
      *puVar21 = *src;
      puVar21[1] = uVar38;
      if (0x10 < uVar33) {
        pBVar14 = seqStore->lit;
        if (0xffffffffffffffe0 < (ulong)((long)(pBVar14 + 0x10) + (-0x10 - (long)puVar32)))
        goto LAB_00151344;
        uVar38 = *(ulong *)((long)src + 0x18);
        *(ulong *)(pBVar14 + 0x10) = *puVar32;
        *(ulong *)(pBVar14 + 0x18) = uVar38;
        if (0x20 < (long)uVar33) {
          lVar20 = 0;
          do {
            puVar8 = (undefined8 *)((long)src + lVar20 + 0x20);
            uVar17 = puVar8[1];
            pBVar6 = pBVar14 + lVar20 + 0x20;
            *(undefined8 *)pBVar6 = *puVar8;
            *(undefined8 *)(pBVar6 + 8) = uVar17;
            puVar8 = (undefined8 *)((long)src + lVar20 + 0x30);
            uVar17 = puVar8[1];
            *(undefined8 *)(pBVar6 + 0x10) = *puVar8;
            *(undefined8 *)(pBVar6 + 0x18) = uVar17;
            lVar20 = lVar20 + 0x20;
          } while (pBVar6 + 0x20 < pBVar14 + uVar33);
        }
      }
    }
    seqStore->lit = seqStore->lit + uVar33;
    if (0xffff < uVar33) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00151325;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
    psVar13 = seqStore->sequences;
    psVar13->litLength = (U16)uVar33;
    psVar13->offBase = uVar25 + 3;
    if (uVar42 < 3) goto LAB_0015128a;
    if (0xffff < uVar42 - 3) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00151306;
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar13->mlBase = (U16)(uVar42 - 3);
    seqStore->sequences = psVar13 + 1;
    uVar33 = (ulong)uVar25;
    local_144 = uVar41;
  }
  puVar45 = (ulong *)((long)puVar45 + uVar42);
  if (puVar45 <= puVar36) {
    uVar41 = UVar35 + 2;
    lVar20 = *(long *)(pBVar10 + uVar41);
    pUVar11[(ulong)(lVar20 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = uVar41;
    pUVar11[(ulong)(*(long *)((long)puVar45 + -2) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] =
         ((int)puVar45 + -2) - iVar46;
    pUVar12[(ulong)(lVar20 * -0x30e4432345000000) >> (bVar23 & 0x3f)] = uVar41;
    pUVar12[(ulong)(*(long *)((long)puVar45 + -1) * -0x30e4432345000000) >> (bVar23 & 0x3f)] =
         ((int)puVar45 + -1) - iVar46;
    do {
      uVar38 = (ulong)local_144;
      uVar41 = (uint)uVar33;
      if ((local_144 == 0) || ((int)*puVar45 != *(int *)((long)puVar45 - uVar38))) break;
      puVar21 = (ulong *)((long)puVar45 + 4);
      puVar47 = (ulong *)((long)puVar45 + (4 - uVar38));
      puVar32 = puVar21;
      if (puVar21 < puVar1) {
        uVar29 = *puVar21 ^ *puVar47;
        uVar33 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
          }
        }
        uVar33 = uVar33 >> 3 & 0x1fffffff;
        if (*puVar47 == *puVar21) {
          puVar32 = (ulong *)((long)puVar45 + 0xc);
          puVar47 = (ulong *)((long)puVar45 + (0xc - uVar38));
          do {
            if (puVar1 <= puVar32) goto LAB_00150394;
            uVar29 = *puVar47;
            uVar39 = *puVar32;
            uVar40 = uVar39 ^ uVar29;
            uVar33 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
              }
            }
            uVar33 = (long)puVar32 + ((uVar33 >> 3 & 0x1fffffff) - (long)puVar21);
            puVar32 = puVar32 + 1;
            puVar47 = puVar47 + 1;
          } while (uVar29 == uVar39);
        }
      }
      else {
LAB_00150394:
        if ((puVar32 < puVar2) && ((int)*puVar47 == (int)*puVar32)) {
          puVar32 = (ulong *)((long)puVar32 + 4);
          puVar47 = (ulong *)((long)puVar47 + 4);
        }
        if ((puVar32 < puVar3) && ((short)*puVar47 == (short)*puVar32)) {
          puVar32 = (ulong *)((long)puVar32 + 2);
          puVar47 = (ulong *)((long)puVar47 + 2);
        }
        if (puVar32 < puVar5) {
          puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar47 == (char)*puVar32));
        }
        uVar33 = (long)puVar32 - (long)puVar21;
      }
      uVar29 = *puVar45;
      UVar35 = (int)puVar45 - iVar46;
      pUVar12[uVar29 * -0x30e4432345000000 >> (bVar23 & 0x3f)] = UVar35;
      pUVar11[uVar29 * -0x30e44323485a9b9d >> (bVar22 & 0x3f)] = UVar35;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
      goto LAB_001512e7;
      if (0x20000 < seqStore->maxNbLit) goto LAB_0015126b;
      puVar21 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar21) goto LAB_001512a9;
      if (puVar5 < puVar45) goto LAB_001512c8;
      if (puVar4 < puVar45) {
        ZSTD_safecopyLiterals((BYTE *)puVar21,(BYTE *)puVar45,(BYTE *)puVar45,(BYTE *)puVar4);
      }
      else {
        uVar29 = puVar45[1];
        *puVar21 = *puVar45;
        puVar21[1] = uVar29;
      }
      psVar13 = seqStore->sequences;
      psVar13->litLength = 0;
      psVar13->offBase = 1;
      if (uVar33 + 4 < 3) goto LAB_0015128a;
      if (0xffff < uVar33 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00151306;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar13->mlBase = (U16)(uVar33 + 1);
      seqStore->sequences = psVar13 + 1;
      puVar45 = (ulong *)((long)puVar45 + uVar33 + 4);
      uVar33 = uVar38;
      local_144 = uVar41;
    } while (puVar45 <= puVar36);
  }
  puVar21 = (ulong *)((long)puVar45 + 1);
  uVar41 = (uint)uVar33;
  src = puVar45;
  if (puVar36 < puVar21) goto LAB_0014f7bb;
  goto LAB_0014f89a;
LAB_0014f05f:
  if (iVar43 != 7) {
    iVar24 = (int)puVar28;
    if (iVar43 != 10) {
      if (iVar43 != 0xb) {
        return (size_t)puVar5;
      }
      if ((uVar26 < (uint)local_100) && (*local_138 == *puVar28)) {
        puVar45 = puVar28 + 1;
        puVar21 = local_138 + 1;
        puVar47 = puVar45;
        if (puVar45 < puVar1) {
          uVar33 = *puVar45 ^ *puVar21;
          uVar42 = 0;
          if (uVar33 != 0) {
            for (; (uVar33 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
            }
          }
          uVar42 = uVar42 >> 3 & 0x1fffffff;
          if (*puVar21 == *puVar45) {
            puVar47 = puVar28 + 2;
            puVar21 = local_138 + 2;
            do {
              if (puVar1 <= puVar47) goto LAB_0014f27c;
              uVar33 = *puVar21;
              uVar38 = *puVar47;
              uVar29 = uVar38 ^ uVar33;
              uVar42 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                }
              }
              uVar42 = (long)puVar47 + ((uVar42 >> 3 & 0x1fffffff) - (long)puVar45);
              puVar47 = puVar47 + 1;
              puVar21 = puVar21 + 1;
            } while (uVar33 == uVar38);
          }
        }
        else {
LAB_0014f27c:
          if ((puVar47 < puVar2) && ((int)*puVar21 == (int)*puVar47)) {
            puVar47 = (ulong *)((long)puVar47 + 4);
            puVar21 = (ulong *)((long)puVar21 + 4);
          }
          if ((puVar47 < puVar3) && ((short)*puVar21 == (short)*puVar47)) {
            puVar47 = (ulong *)((long)puVar47 + 2);
            puVar21 = (ulong *)((long)puVar21 + 2);
          }
          if (puVar47 < puVar5) {
            puVar47 = (ulong *)((long)puVar47 + (ulong)((char)*puVar21 == (char)*puVar47));
          }
          uVar42 = (long)puVar47 - (long)puVar45;
        }
        uVar42 = uVar42 + 8;
        uVar25 = iVar24 - (int)local_138;
        puVar45 = puVar28;
        if ((puVar44 < local_138) && (src < puVar28)) {
          while( true ) {
            puVar47 = (ulong *)((long)puVar28 + -1);
            puVar21 = (ulong *)((long)local_138 + -1);
            puVar45 = puVar28;
            if (*(char *)puVar47 != *(char *)puVar21) break;
            uVar42 = uVar42 + 1;
            puVar45 = puVar47;
            local_138 = puVar21;
            if ((puVar47 <= src) || (puVar28 = puVar47, puVar21 <= puVar44)) break;
          }
        }
      }
      else {
        puVar47 = (ulong *)((long)puVar45 + 4);
        puVar21 = (ulong *)(piVar37 + 1);
        puVar28 = puVar47;
        if (puVar47 < puVar1) {
          uVar33 = *puVar47 ^ *puVar21;
          uVar42 = 0;
          if (uVar33 != 0) {
            for (; (uVar33 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
            }
          }
          uVar42 = uVar42 >> 3 & 0x1fffffff;
          if (*puVar21 == *puVar47) {
            puVar28 = (ulong *)((long)puVar45 + 0xc);
            puVar21 = (ulong *)(piVar37 + 3);
            do {
              if (puVar1 <= puVar28) goto LAB_0014f1b8;
              uVar33 = *puVar21;
              uVar38 = *puVar28;
              uVar29 = uVar38 ^ uVar33;
              uVar42 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                }
              }
              uVar42 = (long)puVar28 + ((uVar42 >> 3 & 0x1fffffff) - (long)puVar47);
              puVar28 = puVar28 + 1;
              puVar21 = puVar21 + 1;
            } while (uVar33 == uVar38);
          }
        }
        else {
LAB_0014f1b8:
          if ((puVar28 < puVar2) && ((int)*puVar21 == (int)*puVar28)) {
            puVar28 = (ulong *)((long)puVar28 + 4);
            puVar21 = (ulong *)((long)puVar21 + 4);
          }
          if ((puVar28 < puVar3) && ((short)*puVar21 == (short)*puVar28)) {
            puVar28 = (ulong *)((long)puVar28 + 2);
            puVar21 = (ulong *)((long)puVar21 + 2);
          }
          if (puVar28 < puVar5) {
            puVar28 = (ulong *)((long)puVar28 + (ulong)((char)*puVar21 == (char)*puVar28));
          }
          uVar42 = (long)puVar28 - (long)puVar47;
        }
        uVar42 = uVar42 + 4;
        local_e0._0_4_ = (int)piVar37;
        uVar25 = (int)puVar45 - (int)local_e0;
        if ((uVar26 < uVar19) && (src < puVar45)) {
          puVar21 = (ulong *)(pBVar10 + ((ulong)uVar19 - 1));
          do {
            puVar47 = (ulong *)((long)puVar45 + -1);
            if ((*(char *)puVar47 != (char)*puVar21) ||
               (uVar42 = uVar42 + 1, puVar45 = puVar47, puVar47 <= src)) break;
            bVar15 = puVar44 < puVar21;
            puVar21 = (ulong *)((long)puVar21 + -1);
          } while (bVar15);
        }
      }
    }
    if (local_e8 < 4) {
      pUVar11[local_90] = iVar24 - iVar46;
    }
    if (uVar25 == 0) goto LAB_00151382;
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) goto LAB_001512e7;
    if (0x20000 < seqStore->maxNbLit) goto LAB_0015126b;
    uVar33 = (long)puVar45 - (long)src;
    puVar21 = (ulong *)seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar21 + uVar33))
    goto LAB_001512a9;
    if (puVar5 < puVar45) goto LAB_001512c8;
    if (puVar4 < puVar45) {
      ZSTD_safecopyLiterals((BYTE *)puVar21,(BYTE *)src,(BYTE *)puVar45,(BYTE *)puVar4);
    }
    else {
      uVar38 = *(ulong *)((long)src + 8);
      *puVar21 = *src;
      puVar21[1] = uVar38;
      if (0x10 < uVar33) {
        pBVar14 = seqStore->lit;
        if (0xffffffffffffffe0 < (ulong)((long)(pBVar14 + 0x10) + (-0x10 - (long)puVar32)))
        goto LAB_00151344;
        uVar38 = *(ulong *)((long)src + 0x18);
        *(ulong *)(pBVar14 + 0x10) = *puVar32;
        *(ulong *)(pBVar14 + 0x18) = uVar38;
        if (0x20 < (long)uVar33) {
          lVar20 = 0;
          do {
            puVar8 = (undefined8 *)((long)src + lVar20 + 0x20);
            uVar17 = puVar8[1];
            pBVar6 = pBVar14 + lVar20 + 0x20;
            *(undefined8 *)pBVar6 = *puVar8;
            *(undefined8 *)(pBVar6 + 8) = uVar17;
            puVar8 = (undefined8 *)((long)src + lVar20 + 0x30);
            uVar17 = puVar8[1];
            *(undefined8 *)(pBVar6 + 0x10) = *puVar8;
            *(undefined8 *)(pBVar6 + 0x18) = uVar17;
            lVar20 = lVar20 + 0x20;
          } while (pBVar6 + 0x20 < pBVar14 + uVar33);
        }
      }
    }
    seqStore->lit = seqStore->lit + uVar33;
    if (0xffff < uVar33) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00151325;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
    psVar13 = seqStore->sequences;
    psVar13->litLength = (U16)uVar33;
    psVar13->offBase = uVar25 + 3;
    if (uVar42 < 3) goto LAB_0015128a;
    if (0xffff < uVar42 - 3) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00151306;
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar13->mlBase = (U16)(uVar42 - 3);
    seqStore->sequences = psVar13 + 1;
    uVar33 = (ulong)uVar25;
    local_144 = uVar41;
  }
  puVar45 = (ulong *)((long)puVar45 + uVar42);
  if (puVar45 <= puVar36) {
    uVar41 = UVar35 + 2;
    lVar20 = *(long *)(pBVar10 + uVar41);
    pUVar11[(ulong)(lVar20 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = uVar41;
    pUVar11[(ulong)(*(long *)((long)puVar45 + -2) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] =
         ((int)puVar45 + -2) - iVar46;
    pUVar12[(ulong)(lVar20 * -0x30e4432340650000) >> (bVar23 & 0x3f)] = uVar41;
    pUVar12[(ulong)(*(long *)((long)puVar45 + -1) * -0x30e4432340650000) >> (bVar23 & 0x3f)] =
         ((int)puVar45 + -1) - iVar46;
    do {
      uVar38 = (ulong)local_144;
      uVar41 = (uint)uVar33;
      if ((local_144 == 0) || ((int)*puVar45 != *(int *)((long)puVar45 - uVar38))) break;
      puVar21 = (ulong *)((long)puVar45 + 4);
      puVar47 = (ulong *)((long)puVar45 + (4 - uVar38));
      puVar32 = puVar21;
      if (puVar21 < puVar1) {
        uVar29 = *puVar21 ^ *puVar47;
        uVar33 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
          }
        }
        uVar33 = uVar33 >> 3 & 0x1fffffff;
        if (*puVar47 == *puVar21) {
          puVar32 = (ulong *)((long)puVar45 + 0xc);
          puVar47 = (ulong *)((long)puVar45 + (0xc - uVar38));
          do {
            if (puVar1 <= puVar32) goto LAB_0014f5fa;
            uVar29 = *puVar47;
            uVar39 = *puVar32;
            uVar40 = uVar39 ^ uVar29;
            uVar33 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
              }
            }
            uVar33 = (long)puVar32 + ((uVar33 >> 3 & 0x1fffffff) - (long)puVar21);
            puVar32 = puVar32 + 1;
            puVar47 = puVar47 + 1;
          } while (uVar29 == uVar39);
        }
      }
      else {
LAB_0014f5fa:
        if ((puVar32 < puVar2) && ((int)*puVar47 == (int)*puVar32)) {
          puVar32 = (ulong *)((long)puVar32 + 4);
          puVar47 = (ulong *)((long)puVar47 + 4);
        }
        if ((puVar32 < puVar3) && ((short)*puVar47 == (short)*puVar32)) {
          puVar32 = (ulong *)((long)puVar32 + 2);
          puVar47 = (ulong *)((long)puVar47 + 2);
        }
        if (puVar32 < puVar5) {
          puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar47 == (char)*puVar32));
        }
        uVar33 = (long)puVar32 - (long)puVar21;
      }
      uVar29 = *puVar45;
      UVar35 = (int)puVar45 - iVar46;
      pUVar12[uVar29 * -0x30e4432340650000 >> (bVar23 & 0x3f)] = UVar35;
      pUVar11[uVar29 * -0x30e44323485a9b9d >> (bVar22 & 0x3f)] = UVar35;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
      goto LAB_001512e7;
      if (0x20000 < seqStore->maxNbLit) goto LAB_0015126b;
      puVar21 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar21) goto LAB_001512a9;
      if (puVar5 < puVar45) goto LAB_001512c8;
      if (puVar4 < puVar45) {
        ZSTD_safecopyLiterals((BYTE *)puVar21,(BYTE *)puVar45,(BYTE *)puVar45,(BYTE *)puVar4);
      }
      else {
        uVar29 = puVar45[1];
        *puVar21 = *puVar45;
        puVar21[1] = uVar29;
      }
      psVar13 = seqStore->sequences;
      psVar13->litLength = 0;
      psVar13->offBase = 1;
      if (uVar33 + 4 < 3) goto LAB_0015128a;
      if (0xffff < uVar33 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00151306;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar13->mlBase = (U16)(uVar33 + 1);
      seqStore->sequences = psVar13 + 1;
      puVar45 = (ulong *)((long)puVar45 + uVar33 + 4);
      uVar33 = uVar38;
      local_144 = uVar41;
    } while (puVar45 <= puVar36);
  }
  puVar21 = (ulong *)((long)puVar45 + 1);
  uVar41 = (uint)uVar33;
  src = puVar45;
  if (puVar36 < puVar21) goto LAB_0014f7bb;
  goto LAB_0014eb00;
LAB_00150b05:
  if (iVar43 != 7) {
    iVar24 = (int)puVar28;
    if (iVar43 != 10) {
      if (iVar43 != 0xb) {
        return (size_t)puVar5;
      }
      if ((uVar26 < (uint)local_e8) && (*local_100 == *puVar28)) {
        puVar45 = puVar28 + 1;
        puVar21 = local_100 + 1;
        puVar47 = puVar45;
        if (puVar45 < puVar1) {
          uVar33 = *puVar45 ^ *puVar21;
          uVar42 = 0;
          if (uVar33 != 0) {
            for (; (uVar33 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
            }
          }
          uVar42 = uVar42 >> 3 & 0x1fffffff;
          if (*puVar21 == *puVar45) {
            puVar47 = puVar28 + 2;
            puVar21 = local_100 + 2;
            do {
              if (puVar1 <= puVar47) goto LAB_00150d32;
              uVar33 = *puVar21;
              uVar38 = *puVar47;
              uVar29 = uVar38 ^ uVar33;
              uVar42 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                }
              }
              uVar42 = (long)puVar47 + ((uVar42 >> 3 & 0x1fffffff) - (long)puVar45);
              puVar47 = puVar47 + 1;
              puVar21 = puVar21 + 1;
            } while (uVar33 == uVar38);
          }
        }
        else {
LAB_00150d32:
          if ((puVar47 < puVar2) && ((int)*puVar21 == (int)*puVar47)) {
            puVar47 = (ulong *)((long)puVar47 + 4);
            puVar21 = (ulong *)((long)puVar21 + 4);
          }
          if ((puVar47 < puVar3) && ((short)*puVar21 == (short)*puVar47)) {
            puVar47 = (ulong *)((long)puVar47 + 2);
            puVar21 = (ulong *)((long)puVar21 + 2);
          }
          if (puVar47 < puVar5) {
            puVar47 = (ulong *)((long)puVar47 + (ulong)((char)*puVar21 == (char)*puVar47));
          }
          uVar42 = (long)puVar47 - (long)puVar45;
        }
        uVar42 = uVar42 + 8;
        local_130 = (BYTE *)(ulong)(uint)(iVar24 - (int)local_100);
        puVar45 = puVar28;
        if ((puVar44 < local_100) && (src < puVar28)) {
          while( true ) {
            puVar47 = (ulong *)((long)puVar28 + -1);
            puVar21 = (ulong *)((long)local_100 + -1);
            puVar45 = puVar28;
            if (*(char *)puVar47 != *(char *)puVar21) break;
            uVar42 = uVar42 + 1;
            puVar45 = puVar47;
            local_100 = puVar21;
            if ((puVar47 <= src) || (puVar28 = puVar47, puVar21 <= puVar44)) break;
          }
        }
      }
      else {
        puVar47 = (ulong *)((long)puVar45 + 4);
        puVar21 = (ulong *)(piVar37 + 1);
        puVar28 = puVar47;
        if (puVar47 < puVar1) {
          uVar33 = *puVar47 ^ *puVar21;
          uVar42 = 0;
          if (uVar33 != 0) {
            for (; (uVar33 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
            }
          }
          uVar42 = uVar42 >> 3 & 0x1fffffff;
          if (*puVar21 == *puVar47) {
            puVar28 = (ulong *)((long)puVar45 + 0xc);
            puVar21 = (ulong *)(piVar37 + 3);
            do {
              if (puVar1 <= puVar28) goto LAB_00150c68;
              uVar33 = *puVar21;
              uVar38 = *puVar28;
              uVar29 = uVar38 ^ uVar33;
              uVar42 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                }
              }
              uVar42 = (long)puVar28 + ((uVar42 >> 3 & 0x1fffffff) - (long)puVar47);
              puVar28 = puVar28 + 1;
              puVar21 = puVar21 + 1;
            } while (uVar33 == uVar38);
          }
        }
        else {
LAB_00150c68:
          if ((puVar28 < puVar2) && ((int)*puVar21 == (int)*puVar28)) {
            puVar28 = (ulong *)((long)puVar28 + 4);
            puVar21 = (ulong *)((long)puVar21 + 4);
          }
          if ((puVar28 < puVar3) && ((short)*puVar21 == (short)*puVar28)) {
            puVar28 = (ulong *)((long)puVar28 + 2);
            puVar21 = (ulong *)((long)puVar21 + 2);
          }
          if (puVar28 < puVar5) {
            puVar28 = (ulong *)((long)puVar28 + (ulong)((char)*puVar21 == (char)*puVar28));
          }
          uVar42 = (long)puVar28 - (long)puVar47;
        }
        uVar42 = uVar42 + 4;
        local_c8 = (int)piVar37;
        local_130 = (BYTE *)(ulong)(uint)((int)puVar45 - local_c8);
        if ((uVar26 < uVar25) && (src < puVar45)) {
          puVar21 = (ulong *)(pBVar14 + uVar25);
          do {
            puVar47 = (ulong *)((long)puVar45 + -1);
            if ((*(char *)puVar47 != (char)*puVar21) ||
               (uVar42 = uVar42 + 1, puVar45 = puVar47, puVar47 <= src)) break;
            bVar15 = puVar44 < puVar21;
            puVar21 = (ulong *)((long)puVar21 + -1);
          } while (bVar15);
        }
      }
    }
    if (local_108 < 4) {
      pUVar11[local_e0] = iVar24 - iVar46;
    }
    if ((int)local_130 == 0) goto LAB_00151382;
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) goto LAB_001512e7;
    if (0x20000 < seqStore->maxNbLit) goto LAB_0015126b;
    uVar33 = (long)puVar45 - (long)src;
    puVar21 = (ulong *)seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar21 + uVar33))
    goto LAB_001512a9;
    if (puVar5 < puVar45) goto LAB_001512c8;
    if (puVar4 < puVar45) {
      ZSTD_safecopyLiterals((BYTE *)puVar21,(BYTE *)src,(BYTE *)puVar45,(BYTE *)puVar4);
    }
    else {
      uVar38 = *(ulong *)((long)src + 8);
      *puVar21 = *src;
      puVar21[1] = uVar38;
      if (0x10 < uVar33) {
        pBVar6 = seqStore->lit;
        if (0xffffffffffffffe0 < (ulong)((long)(pBVar6 + 0x10) + (-0x10 - (long)puVar32)))
        goto LAB_00151344;
        uVar38 = *(ulong *)((long)src + 0x18);
        *(ulong *)(pBVar6 + 0x10) = *puVar32;
        *(ulong *)(pBVar6 + 0x18) = uVar38;
        if (0x20 < (long)uVar33) {
          lVar20 = 0;
          do {
            puVar8 = (undefined8 *)((long)src + lVar20 + 0x20);
            uVar17 = puVar8[1];
            pBVar7 = pBVar6 + lVar20 + 0x20;
            *(undefined8 *)pBVar7 = *puVar8;
            *(undefined8 *)(pBVar7 + 8) = uVar17;
            puVar8 = (undefined8 *)((long)src + lVar20 + 0x30);
            uVar17 = puVar8[1];
            *(undefined8 *)(pBVar7 + 0x10) = *puVar8;
            *(undefined8 *)(pBVar7 + 0x18) = uVar17;
            lVar20 = lVar20 + 0x20;
          } while (pBVar7 + 0x20 < pBVar6 + uVar33);
        }
      }
    }
    seqStore->lit = seqStore->lit + uVar33;
    if (0xffff < uVar33) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00151325;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
    psVar13 = seqStore->sequences;
    psVar13->litLength = (U16)uVar33;
    psVar13->offBase = (int)local_130 + 3;
    if (uVar42 < 3) goto LAB_0015128a;
    if (0xffff < uVar42 - 3) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00151306;
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar13->mlBase = (U16)(uVar42 - 3);
    seqStore->sequences = psVar13 + 1;
    uVar33 = (ulong)local_130 & 0xffffffff;
    local_144 = uVar41;
  }
  puVar45 = (ulong *)((long)puVar45 + uVar42);
  if (puVar45 <= puVar36) {
    uVar41 = UVar35 + 2;
    pUVar11[(ulong)(*(long *)(pBVar10 + uVar41) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = uVar41;
    pUVar11[(ulong)(*(long *)((long)puVar45 + -2) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] =
         ((int)puVar45 + -2) - iVar46;
    pUVar12[(uint)(*(int *)(pBVar10 + uVar41) * -0x61c8864f) >> (bVar23 & 0x1f)] = uVar41;
    pUVar12[(uint)(*(int *)((long)puVar45 + -1) * -0x61c8864f) >> (bVar23 & 0x1f)] =
         ((int)puVar45 + -1) - iVar46;
    do {
      uVar38 = (ulong)local_144;
      uVar41 = (uint)uVar33;
      if ((local_144 == 0) || ((int)*puVar45 != *(int *)((long)puVar45 - uVar38))) break;
      puVar21 = (ulong *)((long)puVar45 + 4);
      puVar47 = (ulong *)((long)puVar45 + (4 - uVar38));
      puVar32 = puVar21;
      if (puVar21 < puVar1) {
        uVar29 = *puVar21 ^ *puVar47;
        uVar33 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
          }
        }
        uVar33 = uVar33 >> 3 & 0x1fffffff;
        if (*puVar47 == *puVar21) {
          puVar32 = (ulong *)((long)puVar45 + 0xc);
          puVar47 = (ulong *)((long)puVar45 + (0xc - uVar38));
          do {
            if (puVar1 <= puVar32) goto LAB_001510c1;
            uVar29 = *puVar47;
            uVar39 = *puVar32;
            uVar40 = uVar39 ^ uVar29;
            uVar33 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
              }
            }
            uVar33 = (long)puVar32 + ((uVar33 >> 3 & 0x1fffffff) - (long)puVar21);
            puVar32 = puVar32 + 1;
            puVar47 = puVar47 + 1;
          } while (uVar29 == uVar39);
        }
      }
      else {
LAB_001510c1:
        if ((puVar32 < puVar2) && ((int)*puVar47 == (int)*puVar32)) {
          puVar32 = (ulong *)((long)puVar32 + 4);
          puVar47 = (ulong *)((long)puVar47 + 4);
        }
        if ((puVar32 < puVar3) && ((short)*puVar47 == (short)*puVar32)) {
          puVar32 = (ulong *)((long)puVar32 + 2);
          puVar47 = (ulong *)((long)puVar47 + 2);
        }
        if (puVar32 < puVar5) {
          puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar47 == (char)*puVar32));
        }
        uVar33 = (long)puVar32 - (long)puVar21;
      }
      UVar35 = (int)puVar45 - iVar46;
      pUVar12[(uint)((int)*puVar45 * -0x61c8864f) >> (bVar23 & 0x1f)] = UVar35;
      pUVar11[*puVar45 * -0x30e44323485a9b9d >> (bVar22 & 0x3f)] = UVar35;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
      goto LAB_001512e7;
      if (0x20000 < seqStore->maxNbLit) goto LAB_0015126b;
      puVar21 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar21) goto LAB_001512a9;
      if (puVar5 < puVar45) goto LAB_001512c8;
      if (puVar4 < puVar45) {
        ZSTD_safecopyLiterals((BYTE *)puVar21,(BYTE *)puVar45,(BYTE *)puVar45,(BYTE *)puVar4);
      }
      else {
        uVar29 = puVar45[1];
        *puVar21 = *puVar45;
        puVar21[1] = uVar29;
      }
      psVar13 = seqStore->sequences;
      psVar13->litLength = 0;
      psVar13->offBase = 1;
      if (uVar33 + 4 < 3) goto LAB_0015128a;
      if (0xffff < uVar33 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00151306;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar13->mlBase = (U16)(uVar33 + 1);
      seqStore->sequences = psVar13 + 1;
      puVar45 = (ulong *)((long)puVar45 + uVar33 + 4);
      uVar33 = uVar38;
      local_144 = uVar41;
    } while (puVar45 <= puVar36);
  }
  puVar21 = (ulong *)((long)puVar45 + 1);
  uVar41 = (uint)uVar33;
  src = puVar45;
  if (puVar36 < puVar21) goto LAB_0014f7bb;
  goto LAB_001505b2;
LAB_0014e326:
  if (iVar43 != 7) {
    iVar24 = (int)puVar28;
    if (iVar43 != 10) {
      if (iVar43 != 0xb) {
        return (size_t)puVar5;
      }
      if ((uVar26 < (uint)local_100) && (*local_138 == *puVar28)) {
        puVar45 = puVar28 + 1;
        puVar21 = local_138 + 1;
        puVar47 = puVar45;
        if (puVar45 < puVar1) {
          uVar33 = *puVar45 ^ *puVar21;
          uVar42 = 0;
          if (uVar33 != 0) {
            for (; (uVar33 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
            }
          }
          uVar42 = uVar42 >> 3 & 0x1fffffff;
          if (*puVar21 == *puVar45) {
            puVar47 = puVar28 + 2;
            puVar21 = local_138 + 2;
            do {
              if (puVar1 <= puVar47) goto LAB_0014e543;
              uVar33 = *puVar21;
              uVar38 = *puVar47;
              uVar29 = uVar38 ^ uVar33;
              uVar42 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                }
              }
              uVar42 = (long)puVar47 + ((uVar42 >> 3 & 0x1fffffff) - (long)puVar45);
              puVar47 = puVar47 + 1;
              puVar21 = puVar21 + 1;
            } while (uVar33 == uVar38);
          }
        }
        else {
LAB_0014e543:
          if ((puVar47 < puVar2) && ((int)*puVar21 == (int)*puVar47)) {
            puVar47 = (ulong *)((long)puVar47 + 4);
            puVar21 = (ulong *)((long)puVar21 + 4);
          }
          if ((puVar47 < puVar3) && ((short)*puVar21 == (short)*puVar47)) {
            puVar47 = (ulong *)((long)puVar47 + 2);
            puVar21 = (ulong *)((long)puVar21 + 2);
          }
          if (puVar47 < puVar5) {
            puVar47 = (ulong *)((long)puVar47 + (ulong)((char)*puVar21 == (char)*puVar47));
          }
          uVar42 = (long)puVar47 - (long)puVar45;
        }
        uVar42 = uVar42 + 8;
        uVar25 = iVar24 - (int)local_138;
        puVar45 = puVar28;
        if ((puVar44 < local_138) && (src < puVar28)) {
          while( true ) {
            puVar47 = (ulong *)((long)puVar28 + -1);
            puVar21 = (ulong *)((long)local_138 + -1);
            puVar45 = puVar28;
            if (*(char *)puVar47 != *(char *)puVar21) break;
            uVar42 = uVar42 + 1;
            puVar45 = puVar47;
            local_138 = puVar21;
            if ((puVar47 <= src) || (puVar28 = puVar47, puVar21 <= puVar44)) break;
          }
        }
      }
      else {
        puVar47 = (ulong *)((long)puVar45 + 4);
        puVar21 = (ulong *)(piVar37 + 1);
        puVar28 = puVar47;
        if (puVar47 < puVar1) {
          uVar33 = *puVar47 ^ *puVar21;
          uVar42 = 0;
          if (uVar33 != 0) {
            for (; (uVar33 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
            }
          }
          uVar42 = uVar42 >> 3 & 0x1fffffff;
          if (*puVar21 == *puVar47) {
            puVar28 = (ulong *)((long)puVar45 + 0xc);
            puVar21 = (ulong *)(piVar37 + 3);
            do {
              if (puVar1 <= puVar28) goto LAB_0014e47f;
              uVar33 = *puVar21;
              uVar38 = *puVar28;
              uVar29 = uVar38 ^ uVar33;
              uVar42 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                }
              }
              uVar42 = (long)puVar28 + ((uVar42 >> 3 & 0x1fffffff) - (long)puVar47);
              puVar28 = puVar28 + 1;
              puVar21 = puVar21 + 1;
            } while (uVar33 == uVar38);
          }
        }
        else {
LAB_0014e47f:
          if ((puVar28 < puVar2) && ((int)*puVar21 == (int)*puVar28)) {
            puVar28 = (ulong *)((long)puVar28 + 4);
            puVar21 = (ulong *)((long)puVar21 + 4);
          }
          if ((puVar28 < puVar3) && ((short)*puVar21 == (short)*puVar28)) {
            puVar28 = (ulong *)((long)puVar28 + 2);
            puVar21 = (ulong *)((long)puVar21 + 2);
          }
          if (puVar28 < puVar5) {
            puVar28 = (ulong *)((long)puVar28 + (ulong)((char)*puVar21 == (char)*puVar28));
          }
          uVar42 = (long)puVar28 - (long)puVar47;
        }
        uVar42 = uVar42 + 4;
        local_e0._0_4_ = (int)piVar37;
        uVar25 = (int)puVar45 - (int)local_e0;
        if ((uVar26 < uVar19) && (src < puVar45)) {
          puVar21 = (ulong *)(pBVar10 + ((ulong)uVar19 - 1));
          do {
            puVar47 = (ulong *)((long)puVar45 + -1);
            if ((*(char *)puVar47 != (char)*puVar21) ||
               (uVar42 = uVar42 + 1, puVar45 = puVar47, puVar47 <= src)) break;
            bVar15 = puVar44 < puVar21;
            puVar21 = (ulong *)((long)puVar21 + -1);
          } while (bVar15);
        }
      }
    }
    if (local_e8 < 4) {
      pUVar11[local_90] = iVar24 - iVar46;
    }
    if (uVar25 == 0) {
LAB_00151382:
      __assert_fail("(offset)>0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x6dc9,
                    "size_t ZSTD_compressBlock_doubleFast_noDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_001512e7:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < seqStore->maxNbLit) {
LAB_0015126b:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar33 = (long)puVar45 - (long)src;
    puVar21 = (ulong *)seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar21 + uVar33)) {
LAB_001512a9:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468e,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (puVar5 < puVar45) {
LAB_001512c8:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (puVar4 < puVar45) {
      ZSTD_safecopyLiterals((BYTE *)puVar21,(BYTE *)src,(BYTE *)puVar45,(BYTE *)puVar4);
    }
    else {
      uVar38 = *(ulong *)((long)src + 8);
      *puVar21 = *src;
      puVar21[1] = uVar38;
      if (0x10 < uVar33) {
        pBVar14 = seqStore->lit;
        if (0xffffffffffffffe0 < (ulong)((long)(pBVar14 + 0x10) + (-0x10 - (long)puVar32))) {
LAB_00151344:
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x36a6,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar38 = *(ulong *)((long)src + 0x18);
        *(ulong *)(pBVar14 + 0x10) = *puVar32;
        *(ulong *)(pBVar14 + 0x18) = uVar38;
        if (0x20 < (long)uVar33) {
          lVar20 = 0;
          do {
            puVar8 = (undefined8 *)((long)src + lVar20 + 0x20);
            uVar17 = puVar8[1];
            pBVar6 = pBVar14 + lVar20 + 0x20;
            *(undefined8 *)pBVar6 = *puVar8;
            *(undefined8 *)(pBVar6 + 8) = uVar17;
            puVar8 = (undefined8 *)((long)src + lVar20 + 0x30);
            uVar17 = puVar8[1];
            *(undefined8 *)(pBVar6 + 0x10) = *puVar8;
            *(undefined8 *)(pBVar6 + 0x18) = uVar17;
            lVar20 = lVar20 + 0x20;
          } while (pBVar6 + 0x20 < pBVar14 + uVar33);
        }
      }
    }
    seqStore->lit = seqStore->lit + uVar33;
    if (0xffff < uVar33) {
      if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_00151325:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46a0,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
    psVar13 = seqStore->sequences;
    psVar13->litLength = (U16)uVar33;
    psVar13->offBase = uVar25 + 3;
    if (uVar42 < 3) {
LAB_0015128a:
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x46aa,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0xffff < uVar42 - 3) {
      if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_00151306:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46ad,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar13->mlBase = (U16)(uVar42 - 3);
    seqStore->sequences = psVar13 + 1;
    uVar33 = (ulong)uVar25;
    local_144 = uVar41;
  }
  puVar45 = (ulong *)((long)puVar45 + uVar42);
  if (puVar45 <= puVar36) {
    uVar41 = UVar35 + 2;
    lVar20 = *(long *)(pBVar10 + uVar41);
    pUVar11[(ulong)(lVar20 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = uVar41;
    pUVar11[(ulong)(*(long *)((long)puVar45 + -2) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] =
         ((int)puVar45 + -2) - iVar46;
    pUVar12[(ulong)(lVar20 * -0x30e44323405a9d00) >> (bVar23 & 0x3f)] = uVar41;
    pUVar12[(ulong)(*(long *)((long)puVar45 + -1) * -0x30e44323405a9d00) >> (bVar23 & 0x3f)] =
         ((int)puVar45 + -1) - iVar46;
    do {
      uVar38 = (ulong)local_144;
      uVar41 = (uint)uVar33;
      if ((local_144 == 0) || ((int)*puVar45 != *(int *)((long)puVar45 - uVar38))) break;
      puVar21 = (ulong *)((long)puVar45 + 4);
      puVar47 = (ulong *)((long)puVar45 + (4 - uVar38));
      puVar32 = puVar21;
      if (puVar21 < puVar1) {
        uVar29 = *puVar21 ^ *puVar47;
        uVar33 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
          }
        }
        uVar33 = uVar33 >> 3 & 0x1fffffff;
        if (*puVar47 == *puVar21) {
          puVar32 = (ulong *)((long)puVar45 + 0xc);
          puVar47 = (ulong *)((long)puVar45 + (0xc - uVar38));
          do {
            if (puVar1 <= puVar32) goto LAB_0014e8c1;
            uVar29 = *puVar47;
            uVar39 = *puVar32;
            uVar40 = uVar39 ^ uVar29;
            uVar33 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
              }
            }
            uVar33 = (long)puVar32 + ((uVar33 >> 3 & 0x1fffffff) - (long)puVar21);
            puVar32 = puVar32 + 1;
            puVar47 = puVar47 + 1;
          } while (uVar29 == uVar39);
        }
      }
      else {
LAB_0014e8c1:
        if ((puVar32 < puVar2) && ((int)*puVar47 == (int)*puVar32)) {
          puVar32 = (ulong *)((long)puVar32 + 4);
          puVar47 = (ulong *)((long)puVar47 + 4);
        }
        if ((puVar32 < puVar3) && ((short)*puVar47 == (short)*puVar32)) {
          puVar32 = (ulong *)((long)puVar32 + 2);
          puVar47 = (ulong *)((long)puVar47 + 2);
        }
        if (puVar32 < puVar5) {
          puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar47 == (char)*puVar32));
        }
        uVar33 = (long)puVar32 - (long)puVar21;
      }
      uVar29 = *puVar45;
      UVar35 = (int)puVar45 - iVar46;
      pUVar12[uVar29 * -0x30e44323405a9d00 >> (bVar23 & 0x3f)] = UVar35;
      pUVar11[uVar29 * -0x30e44323485a9b9d >> (bVar22 & 0x3f)] = UVar35;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
      goto LAB_001512e7;
      if (0x20000 < seqStore->maxNbLit) goto LAB_0015126b;
      puVar21 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar21) goto LAB_001512a9;
      if (puVar5 < puVar45) goto LAB_001512c8;
      if (puVar4 < puVar45) {
        ZSTD_safecopyLiterals((BYTE *)puVar21,(BYTE *)puVar45,(BYTE *)puVar45,(BYTE *)puVar4);
      }
      else {
        uVar29 = puVar45[1];
        *puVar21 = *puVar45;
        puVar21[1] = uVar29;
      }
      psVar13 = seqStore->sequences;
      psVar13->litLength = 0;
      psVar13->offBase = 1;
      if (uVar33 + 4 < 3) goto LAB_0015128a;
      if (0xffff < uVar33 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00151306;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar13->mlBase = (U16)(uVar33 + 1);
      seqStore->sequences = psVar13 + 1;
      puVar45 = (ulong *)((long)puVar45 + uVar33 + 4);
      uVar33 = uVar38;
      local_144 = uVar41;
    } while (puVar45 <= puVar36);
  }
  puVar21 = (ulong *)((long)puVar45 + 1);
  uVar41 = (uint)uVar33;
  src = puVar45;
  if (puVar36 < puVar21) goto LAB_0014f7bb;
  goto LAB_0014ddc7;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_noDict_4(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_doubleFast_noDict_5(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_doubleFast_noDict_6(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_doubleFast_noDict_7(ms, seqStore, rep, src, srcSize);
    }
}